

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O0

int generate_proof(VOPRF_METHOD *method,CBB *cbb,TRUST_TOKEN_ISSUER_KEY *priv,EC_SCALAR *r,
                  EC_JACOBIAN *M,EC_JACOBIAN *Z)

{
  int iVar1;
  undefined1 local_6c0 [8];
  EC_SCALAR s;
  EC_SCALAR c_mont;
  EC_SCALAR c;
  EC_AFFINE affines [4];
  EC_JACOBIAN jacobians [4];
  EC_GROUP *group;
  EC_JACOBIAN *Z_local;
  EC_JACOBIAN *M_local;
  EC_SCALAR *r_local;
  TRUST_TOKEN_ISSUER_KEY *priv_local;
  CBB *cbb_local;
  VOPRF_METHOD *method_local;
  
  jacobians[3].Z.words[8] = (BN_ULONG)(*method->group_func)();
  iVar1 = ec_point_mul_scalar_base
                    ((EC_GROUP *)jacobians[3].Z.words[8],(EC_JACOBIAN *)(jacobians[1].Z.words + 8),r
                    );
  if ((iVar1 == 0) ||
     (iVar1 = ec_point_mul_scalar((EC_GROUP *)jacobians[3].Z.words[8],
                                  (EC_JACOBIAN *)(jacobians[2].Z.words + 8),M,r), iVar1 == 0)) {
    return 0;
  }
  memcpy(affines[3].Y.words + 8,M,0xd8);
  memcpy(jacobians[0].Z.words + 8,Z,0xd8);
  iVar1 = ec_jacobian_to_affine_batch
                    ((EC_GROUP *)jacobians[3].Z.words[8],(EC_AFFINE *)(c.words + 8),
                     (EC_JACOBIAN *)(affines[3].Y.words + 8),4);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = hash_to_scalar_challenge
                    (method,(EC_SCALAR *)(c_mont.words + 8),&priv->pubs,(EC_AFFINE *)(c.words + 8),
                     (EC_AFFINE *)(affines[0].Y.words + 8),(EC_AFFINE *)(affines[1].Y.words + 8),
                     (EC_AFFINE *)(affines[2].Y.words + 8));
  if (iVar1 == 0) {
    return 0;
  }
  ec_scalar_to_montgomery
            ((EC_GROUP *)jacobians[3].Z.words[8],(EC_SCALAR *)(s.words + 8),
             (EC_SCALAR *)(c_mont.words + 8));
  ec_scalar_mul_montgomery
            ((EC_GROUP *)jacobians[3].Z.words[8],(EC_SCALAR *)local_6c0,&priv->xs,
             (EC_SCALAR *)(s.words + 8));
  ec_scalar_sub((EC_GROUP *)jacobians[3].Z.words[8],(EC_SCALAR *)local_6c0,r,(EC_SCALAR *)local_6c0)
  ;
  iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[3].Z.words[8],(EC_SCALAR *)(c_mont.words + 8));
  if ((iVar1 != 0) &&
     (iVar1 = scalar_to_cbb(cbb,(EC_GROUP *)jacobians[3].Z.words[8],(EC_SCALAR *)local_6c0),
     iVar1 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

static int generate_proof(const VOPRF_METHOD *method, CBB *cbb,
                          const TRUST_TOKEN_ISSUER_KEY *priv,
                          const EC_SCALAR *r, const EC_JACOBIAN *M,
                          const EC_JACOBIAN *Z) {
  const EC_GROUP *group = method->group_func();

  enum {
    idx_M,
    idx_Z,
    idx_t2,
    idx_t3,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  if (!ec_point_mul_scalar_base(group, &jacobians[idx_t2], r) ||
      !ec_point_mul_scalar(group, &jacobians[idx_t3], M, r)) {
    return 0;
  }


  EC_AFFINE affines[num_idx];
  jacobians[idx_M] = *M;
  jacobians[idx_Z] = *Z;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  EC_SCALAR c;
  if (!hash_to_scalar_challenge(method, &c, &priv->pubs, &affines[idx_M],
                                &affines[idx_Z], &affines[idx_t2],
                                &affines[idx_t3])) {
    return 0;
  }

  EC_SCALAR c_mont;
  ec_scalar_to_montgomery(group, &c_mont, &c);

  // s = r - c*xs
  EC_SCALAR s;
  ec_scalar_mul_montgomery(group, &s, &priv->xs, &c_mont);
  ec_scalar_sub(group, &s, r, &s);

  // Store DLEQ proof in transcript.
  if (!scalar_to_cbb(cbb, group, &c) || !scalar_to_cbb(cbb, group, &s)) {
    return 0;
  }

  return 1;
}